

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compressionTables.cpp
# Opt level: O0

uint16_t handleQuantizeSmallerSig
                   (uint16_t abssrc,uint16_t npow2,uint16_t mask,float errTol,float srcFloat,
                   int doprint)

{
  ushort src;
  int iVar1;
  int iVar2;
  int in_ECX;
  ushort in_DX;
  short in_SI;
  ushort in_DI;
  float in_XMM0_Da;
  float fVar3;
  float fVar4;
  float in_XMM1_Da;
  int srcbits;
  float delta1;
  float delta;
  int bits1;
  int bits0;
  uint16_t alt1;
  uint16_t alt0;
  ushort local_36;
  
  local_36 = in_DI & in_DX;
  src = in_DI + in_SI & in_DX;
  if (in_ECX != 0) {
    printf("  test0  0x%04X %016b\n",(ulong)local_36,(ulong)local_36);
    printf("  test1  0x%04X %016b\n",(ulong)src,(ulong)src);
  }
  iVar1 = countSetBits(local_36);
  iVar2 = countSetBits(src);
  if (iVar2 < iVar1) {
    fVar3 = imath_half_to_float(src);
    if (fVar3 - in_XMM1_Da < in_XMM0_Da) {
      return src;
    }
    fVar4 = imath_half_to_float(local_36);
    fVar4 = in_XMM1_Da - fVar4;
    src = local_36;
  }
  else if (iVar2 == iVar1) {
    fVar3 = imath_half_to_float(local_36);
    fVar4 = imath_half_to_float(src);
    fVar4 = fVar4 - in_XMM1_Da;
    if (in_XMM1_Da - fVar3 < in_XMM0_Da) {
      if (fVar4 < in_XMM1_Da - fVar3) {
        local_36 = src;
      }
      return local_36;
    }
  }
  else {
    fVar3 = imath_half_to_float(local_36);
    if (in_XMM1_Da - fVar3 < in_XMM0_Da) {
      return local_36;
    }
    iVar1 = countSetBits(in_DI);
    if (iVar1 <= iVar2) {
      return in_DI;
    }
    fVar4 = imath_half_to_float(src);
    fVar4 = fVar4 - in_XMM1_Da;
  }
  if (in_XMM0_Da <= fVar4) {
    return in_DI;
  }
  return src;
}

Assistant:

static inline uint16_t handleQuantizeSmallerSig (
    uint16_t abssrc, uint16_t npow2, uint16_t mask, float errTol, float srcFloat, int doprint)
{
    // in this case, only need to test two cases:
    //
    // base truncation and rounded truncation
    uint16_t alt0 = (abssrc & mask);
    uint16_t alt1 = ((abssrc + npow2) & mask);

    if (doprint)
    {
        printf ("  test0  0x%04X %016b\n", alt0, alt0);
        printf ("  test1  0x%04X %016b\n", alt1, alt1);
    }

    int bits0 = countSetBits (alt0);
    int bits1 = countSetBits (alt1);

    float delta;

    if (bits1 < bits0)
    {
        delta = imath_half_to_float(alt1) - srcFloat; // alt1 >= srcFloat
        // bits1 < bits0 and if ok, just return
        if (delta < errTol)
            return alt1;
        delta = srcFloat - imath_half_to_float(alt0); // alt0 <= srcFloat
        if (delta < errTol)
            return alt0;
    }
    else if (bits1 == bits0)
    {
        delta = srcFloat - imath_half_to_float(alt0);
        float delta1 = imath_half_to_float(alt1) - srcFloat;
        if (delta < errTol)
            return (delta1 < delta) ? alt1 : alt0;

        if (delta1 < errTol)
            return alt1;
    }
    else
    {
        delta = srcFloat - imath_half_to_float(alt0);
        // bits0 < bits1 so if ok, just return
        if (delta < errTol)
            return alt0;

        // fallback...
        // in this case, alt1 rounding could have made
        // bits1 larger than src, test for that
        int srcbits = countSetBits (abssrc);
        if (bits1 < srcbits)
        {
            delta = imath_half_to_float(alt1) - srcFloat;
            if (delta < errTol)
                return alt1;
        }
    }
    return abssrc;
}